

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
ON_PhysicallyBasedMaterialUserData::Read
          (ON_PhysicallyBasedMaterialUserData *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  uint in_EAX;
  uint uVar3;
  int chunk_version;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,(int *)((long)&uStack_28 + 4));
  if (bVar1) {
    if (uStack_28._4_4_ - 1U < 2) {
      bVar2 = Parameters::Read(&this->m_parameters,archive,uStack_28._4_4_);
    }
    else {
      bVar2 = false;
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar1 = (bool)(bVar1 & bVar2);
    uVar3 = (*(this->super_ON_UserData).super_ON_Object._vptr_ON_Object[6])(this,0);
    ON_REMOVE_ASAP_AssertEx
              (uVar3 & 0xff,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0x21f6,"","IsValid() is false");
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Read(ON_BinaryArchive& archive) override
  {
    int chunk_version = 0;
    if (false == archive.BeginRead3dmAnonymousChunk(&chunk_version))
      return false;

    bool rc = false;

    if (chunk_version == 1 || chunk_version == 2)
    {
      rc = m_parameters.Read(archive, chunk_version);
    }

    if (!archive.EndRead3dmChunk())
    {
      rc = false;
    }

    ON_ASSERT(IsValid());
    return rc;
  }